

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

CollSeq * sqlite3ExprCollSeq(Parse *pParse,Expr *pExpr)

{
  u8 uVar1;
  uint uVar2;
  sqlite3 *db;
  ExprList *pEVar3;
  ulong uVar4;
  CollSeq *pColl;
  CollSeq *pCVar5;
  Expr *pEVar6;
  long lVar7;
  
  db = pParse->db;
LAB_00161fac:
  do {
    pEVar6 = pExpr;
    if (pEVar6 == (Expr *)0x0) {
      return (CollSeq *)0x0;
    }
    uVar2 = pEVar6->flags;
    if ((uVar2 >> 9 & 1) != 0) {
      return (CollSeq *)0x0;
    }
    uVar1 = pEVar6->op;
    if (uVar1 == 0xa8) {
      uVar1 = pEVar6->op2;
    }
    if (uVar1 == '$') {
LAB_00162084:
      pExpr = pEVar6->pLeft;
      goto LAB_00161fac;
    }
    if (((uVar1 == 'M') || (uVar1 == 0xa2)) || (uVar1 == 0xa4)) {
      if ((pEVar6->y).pTab != (Table *)0x0) {
        if ((long)pEVar6->iColumn < 0) {
          return (CollSeq *)0x0;
        }
        pColl = sqlite3FindCollSeq(db,db->enc,((pEVar6->y).pTab)->aCol[pEVar6->iColumn].zColl,0);
        goto LAB_001620cb;
      }
    }
    else if (uVar1 == 0xa6) goto LAB_00162084;
    if (uVar1 == 'j') {
      pColl = sqlite3GetCollSeq(pParse,db->enc,(CollSeq *)0x0,(pEVar6->u).zToken);
LAB_001620cb:
      if (pColl == (CollSeq *)0x0) {
        return (CollSeq *)0x0;
      }
      if ((pColl->xCmp == (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0) &&
         (pCVar5 = sqlite3GetCollSeq(pParse,pParse->db->enc,pColl,pColl->zName),
         pCVar5 == (CollSeq *)0x0)) {
        pColl = (CollSeq *)0x0;
      }
      return pColl;
    }
    if ((uVar2 >> 8 & 1) == 0) {
      return (CollSeq *)0x0;
    }
    pExpr = pEVar6->pLeft;
    if ((pExpr == (Expr *)0x0) || ((pExpr->flags & 0x100) == 0)) {
      pEVar3 = (pEVar6->x).pList;
      pExpr = pEVar6->pRight;
      if ((uVar2 >> 0xb & 1) == 0 && pEVar3 != (ExprList *)0x0) {
        uVar4 = (ulong)(uint)pEVar3->nExpr;
        if (pEVar3->nExpr < 1) {
          uVar4 = 0;
        }
        lVar7 = 0;
        do {
          pExpr = pEVar6->pRight;
          if (uVar4 * 0x20 + 0x20 == lVar7 + 0x20) break;
          pExpr = *(Expr **)((long)&pEVar3->a[0].pExpr + lVar7);
          lVar7 = lVar7 + 0x20;
        } while ((pExpr->flags & 0x100) == 0);
      }
    }
  } while( true );
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3ExprCollSeq(Parse *pParse, Expr *pExpr){
  sqlite3 *db = pParse->db;
  CollSeq *pColl = 0;
  Expr *p = pExpr;
  while( p ){
    int op = p->op;
    if( p->flags & EP_Generic ) break;
    if( op==TK_REGISTER ) op = p->op2;
    if( (op==TK_AGG_COLUMN || op==TK_COLUMN || op==TK_TRIGGER)
     && p->y.pTab!=0
    ){
      /* op==TK_REGISTER && p->y.pTab!=0 happens when pExpr was originally
      ** a TK_COLUMN but was previously evaluated and cached in a register */
      int j = p->iColumn;
      if( j>=0 ){
        const char *zColl = p->y.pTab->aCol[j].zColl;
        pColl = sqlite3FindCollSeq(db, ENC(db), zColl, 0);
      }
      break;
    }
    if( op==TK_CAST || op==TK_UPLUS ){
      p = p->pLeft;
      continue;
    }
    if( op==TK_COLLATE ){
      pColl = sqlite3GetCollSeq(pParse, ENC(db), 0, p->u.zToken);
      break;
    }
    if( p->flags & EP_Collate ){
      if( p->pLeft && (p->pLeft->flags & EP_Collate)!=0 ){
        p = p->pLeft;
      }else{
        Expr *pNext  = p->pRight;
        /* The Expr.x union is never used at the same time as Expr.pRight */
        assert( p->x.pList==0 || p->pRight==0 );
        /* p->flags holds EP_Collate and p->pLeft->flags does not.  And
        ** p->x.pSelect cannot.  So if p->x.pLeft exists, it must hold at
        ** least one EP_Collate. Thus the following two ALWAYS. */
        if( p->x.pList!=0 && ALWAYS(!ExprHasProperty(p, EP_xIsSelect)) ){
          int i;
          for(i=0; ALWAYS(i<p->x.pList->nExpr); i++){
            if( ExprHasProperty(p->x.pList->a[i].pExpr, EP_Collate) ){
              pNext = p->x.pList->a[i].pExpr;
              break;
            }
          }
        }
        p = pNext;
      }
    }else{
      break;
    }
  }
  if( sqlite3CheckCollSeq(pParse, pColl) ){ 
    pColl = 0;
  }
  return pColl;
}